

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometry(OgreBinarySerializer *this,VertexData *dest)

{
  uint16_t uVar1;
  uint32_t uVar2;
  Logger *this_00;
  ostream *poVar3;
  char *local_1c0 [4];
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1a0 [376];
  
  uVar2 = Read<unsigned_int>(this);
  (dest->super_IVertexData).count = uVar2;
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[25]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
             (char (*) [25])"  - Reading geometry of ");
  poVar3 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (local_1a0,(uint *)dest);
  std::operator<<(poVar3," vertices");
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,local_1c0[0]);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
    return;
  }
  do {
    uVar1 = ReadHeader(this,true);
    do {
      if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
        return;
      }
      if (uVar1 == 0x5100) {
        ReadGeometryVertexDeclaration(this,dest);
      }
      else {
        if (uVar1 != 0x5200) {
          RollbackHeader(this);
          return;
        }
        ReadGeometryVertexBuffer(this,dest);
      }
    } while (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current);
  } while( true );
}

Assistant:

void OgreBinarySerializer::ReadGeometry(VertexData *dest)
{
    dest->count = Read<uint32_t>();

    ASSIMP_LOG_DEBUG_F( "  - Reading geometry of ", dest->count, " vertices");

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_GEOMETRY_VERTEX_DECLARATION ||
             id == M_GEOMETRY_VERTEX_BUFFER))
        {
            switch(id)
            {
                case M_GEOMETRY_VERTEX_DECLARATION:
                {
                    ReadGeometryVertexDeclaration(dest);
                    break;
                }
                case M_GEOMETRY_VERTEX_BUFFER:
                {
                    ReadGeometryVertexBuffer(dest);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}